

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyEnvironment.cpp
# Opt level: O0

void __thiscall
Js::WebAssemblyEnvironment::CalculateOffsets
          (WebAssemblyEnvironment *this,WebAssemblyTable *table,WebAssemblyMemory *memory)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  uint lhs;
  uint32 uVar4;
  uint uVar5;
  WebAssemblyModule *pWVar6;
  undefined4 *puVar7;
  undefined1 local_b8 [4];
  uint32 size;
  uint32 local_94;
  WasmDataSegment *pWStack_90;
  uint32 offset_1;
  WasmDataSegment *segment;
  ArrayBufferBase *pAStack_80;
  uint32 iSeg;
  ArrayBufferBase *buffer;
  uint local_54;
  WasmElementSegment *pWStack_50;
  uint offset;
  WasmElementSegment *eSeg;
  undefined1 auStack_40 [4];
  uint elementsIndex;
  anon_class_16_2_a175977a outOfRangeError;
  int32 hCode;
  ScriptContext *scriptContext;
  WebAssemblyMemory *memory_local;
  WebAssemblyTable *table_local;
  WebAssemblyEnvironment *this_local;
  
  this->offsetInitialized = true;
  pWVar6 = Memory::WriteBarrierPtr<Js::WebAssemblyModule>::operator->(&this->module);
  _auStack_40 = RecyclableObject::GetScriptContext((RecyclableObject *)pWVar6);
  if ((table != (WebAssemblyTable *)0x0) && (memory != (WebAssemblyMemory *)0x0)) {
    outOfRangeError.hCode._4_4_ = 0x800a1b67;
    outOfRangeError.scriptContext = (ScriptContext *)((long)&outOfRangeError.hCode + 4);
    eSeg._4_4_ = 0;
    while( true ) {
      uVar5 = eSeg._4_4_;
      pWVar6 = Memory::WriteBarrierPtr<Js::WebAssemblyModule>::operator->(&this->module);
      uVar3 = WebAssemblyModule::GetElementSegCount(pWVar6);
      if (uVar3 <= uVar5) break;
      pWVar6 = Memory::WriteBarrierPtr<Js::WebAssemblyModule>::operator->(&this->module);
      pWStack_50 = WebAssemblyModule::GetElementSeg(pWVar6,eSeg._4_4_);
      pWVar6 = Memory::WriteBarrierPtr<Js::WebAssemblyModule>::operator->(&this->module);
      Wasm::WasmElementSegment::GetOffsetExpr((WasmNode *)&buffer,pWStack_50);
      lhs = WebAssemblyModule::GetOffsetFromInit(pWVar6,(WasmNode *)&buffer,this);
      local_54 = lhs;
      uVar3 = Wasm::WasmElementSegment::GetNumElements(pWStack_50);
      uVar3 = UInt32Math::
              Add<Js::WebAssemblyEnvironment::CalculateOffsets(Js::WebAssemblyTable*,Js::WebAssemblyMemory*)::__0>
                        (lhs,uVar3,(anon_class_16_2_a175977a *)auStack_40);
      uVar4 = WebAssemblyTable::GetCurrentLength(table);
      if (uVar4 < uVar3) {
        CalculateOffsets::anon_class_16_2_a175977a::operator()
                  ((anon_class_16_2_a175977a *)auStack_40);
      }
      this->elementSegmentOffsets[eSeg._4_4_] = local_54;
      eSeg._4_4_ = eSeg._4_4_ + 1;
    }
    pAStack_80 = WebAssemblyMemory::GetBuffer(memory);
    bVar2 = ArrayBufferBase::IsDetached(pAStack_80);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyEnvironment.cpp"
                                  ,0xd7,"(!buffer->IsDetached())","!buffer->IsDetached()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    outOfRangeError.hCode._4_4_ = 0x800a1b5c;
    segment._4_4_ = 0;
    do {
      uVar5 = segment._4_4_;
      pWVar6 = Memory::WriteBarrierPtr<Js::WebAssemblyModule>::operator->(&this->module);
      uVar3 = WebAssemblyModule::GetDataSegCount(pWVar6);
      if (uVar3 <= uVar5) {
        return;
      }
      pWVar6 = Memory::WriteBarrierPtr<Js::WebAssemblyModule>::operator->(&this->module);
      pWStack_90 = WebAssemblyModule::GetDataSeg(pWVar6,segment._4_4_);
      if (pWStack_90 == (WasmDataSegment *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyEnvironment.cpp"
                                    ,0xdc,"(segment != nullptr)","segment != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      pWVar6 = Memory::WriteBarrierPtr<Js::WebAssemblyModule>::operator->(&this->module);
      Wasm::WasmDataSegment::GetOffsetExpr((WasmNode *)local_b8,pWStack_90);
      local_94 = WebAssemblyModule::GetOffsetFromInit(pWVar6,(WasmNode *)local_b8,this);
      uVar3 = Wasm::WasmDataSegment::GetSourceSize(pWStack_90);
      uVar3 = UInt32Math::
              Add<Js::WebAssemblyEnvironment::CalculateOffsets(Js::WebAssemblyTable*,Js::WebAssemblyMemory*)::__0>
                        (local_94,uVar3,(anon_class_16_2_a175977a *)auStack_40);
      uVar5 = (*(pAStack_80->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
      if (uVar5 < uVar3) {
        CalculateOffsets::anon_class_16_2_a175977a::operator()
                  ((anon_class_16_2_a175977a *)auStack_40);
      }
      this->dataSegmentOffsets[segment._4_4_] = local_94;
      segment._4_4_ = segment._4_4_ + 1;
    } while( true );
  }
  JavascriptError::ThrowTypeError(_auStack_40,-0x7ff5ec71,(PCWSTR)0x0);
}

Assistant:

void WebAssemblyEnvironment::CalculateOffsets(WebAssemblyTable* table, WebAssemblyMemory* memory)
{
    DebugOnly(offsetInitialized = true);
    ScriptContext* scriptContext = module->GetScriptContext();
    if (!table || !memory)
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject);
    }

    int32 hCode = WASMERR_ElementSegOutOfRange;
    auto outOfRangeError = [scriptContext, &hCode] { JavascriptError::ThrowWebAssemblyLinkError(scriptContext, hCode); };

    for (uint elementsIndex = 0; elementsIndex < module->GetElementSegCount(); ++elementsIndex)
    {
        Wasm::WasmElementSegment* eSeg = module->GetElementSeg(elementsIndex);
        uint offset = module->GetOffsetFromInit(eSeg->GetOffsetExpr(), this);
        if (UInt32Math::Add(offset, eSeg->GetNumElements(), outOfRangeError) > table->GetCurrentLength())
        {
            outOfRangeError();
        }
        this->elementSegmentOffsets[elementsIndex] = offset;
    }

    ArrayBufferBase* buffer = memory->GetBuffer();
    Assert(!buffer->IsDetached());
    hCode = WASMERR_DataSegOutOfRange;
    for (uint32 iSeg = 0; iSeg < module->GetDataSegCount(); ++iSeg)
    {
        Wasm::WasmDataSegment* segment = module->GetDataSeg(iSeg);
        Assert(segment != nullptr);
        const uint32 offset = module->GetOffsetFromInit(segment->GetOffsetExpr(), this);
        const uint32 size = segment->GetSourceSize();

        if (UInt32Math::Add(offset, size, outOfRangeError) > buffer->GetByteLength())
        {
            outOfRangeError();
        }
        this->dataSegmentOffsets[iSeg] = offset;
    }
}